

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O0

void __thiscall Nonogram::set_horizontal(Nonogram *this,Known *known,uint y)

{
  const_reference cVar1;
  reference pvVar2;
  reference local_40;
  reference local_30;
  int local_20;
  uint local_1c;
  int i;
  uint y_local;
  Known *known_local;
  Nonogram *this_local;
  
  local_1c = y;
  _i = known;
  known_local = (Known *)this;
  for (local_20 = 0; local_20 < this->m_x; local_20 = local_20 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&_i->first,(long)local_20);
    if (cVar1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&_i->first,(long)local_20);
      pvVar2 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[](&this->m_set,(long)local_20);
      local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar2,(ulong)local_1c);
      std::_Bit_reference::operator=(&local_30,cVar1);
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&_i->second,(long)local_20);
      pvVar2 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[](&this->m_value,(long)local_20);
      local_40 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar2,(ulong)local_1c);
      std::_Bit_reference::operator=(&local_40,cVar1);
    }
  }
  return;
}

Assistant:

void Nonogram::set_horizontal(const Known &known, unsigned int y) {
    for (int i = 0; i < m_x; i++) {
        if (known.first[i]) {
            m_set[i][y] = known.first[i];
            m_value[i][y] = known.second[i];
        }
    }
}